

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void obj_to_keeper(OBJ_DATA *obj,CHAR_DATA *ch)

{
  OBJ_DATA *pOVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *in_RSI;
  OBJ_DATA *in_RDI;
  OBJ_DATA *unaff_retaddr;
  OBJ_DATA *t_obj_next;
  OBJ_DATA *t_obj;
  OBJ_DATA *in_stack_ffffffffffffffe0;
  OBJ_DATA *obj_00;
  
  pOVar1 = in_RSI->carrying;
  do {
    obj_00 = pOVar1;
    if (obj_00 == (OBJ_DATA *)0x0) goto LAB_0057b8cb;
    in_stack_ffffffffffffffe0 = obj_00->next_content;
    pOVar1 = in_stack_ffffffffffffffe0;
  } while ((in_RDI->pIndexData != obj_00->pIndexData) ||
          (bVar2 = str_cmp(in_RDI->short_descr,obj_00->short_descr),
          pOVar1 = in_stack_ffffffffffffffe0, bVar2));
  bVar2 = is_obj_stat(obj_00,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (bVar2) {
    extract_obj(unaff_retaddr);
  }
  else {
    in_RDI->cost = obj_00->cost;
LAB_0057b8cb:
    if (obj_00 == (OBJ_DATA *)0x0) {
      in_RDI->next_content = in_RSI->carrying;
      in_RSI->carrying = in_RDI;
    }
    else {
      in_RDI->next_content = obj_00->next_content;
      obj_00->next_content = in_RDI;
    }
    in_RDI->carried_by = in_RSI;
    in_RDI->in_room = (ROOM_INDEX_DATA *)0x0;
    in_RDI->in_obj = (OBJ_DATA *)0x0;
    iVar3 = get_obj_number(in_RDI);
    in_RSI->carry_number = in_RSI->carry_number + (short)iVar3;
    iVar3 = get_obj_weight(in_stack_ffffffffffffffe0);
    in_RSI->carry_weight = in_RSI->carry_weight + (short)iVar3;
  }
  return;
}

Assistant:

void obj_to_keeper(OBJ_DATA *obj, CHAR_DATA *ch)
{
	OBJ_DATA *t_obj, *t_obj_next;

	/* see if any duplicates are found */
	for (t_obj = ch->carrying; t_obj != nullptr; t_obj = t_obj_next)
	{
		t_obj_next = t_obj->next_content;

		if (obj->pIndexData == t_obj->pIndexData && !str_cmp(obj->short_descr, t_obj->short_descr))
		{
			/* if this is an unlimited item, destroy the new one */
			if (is_obj_stat(t_obj, ITEM_INVENTORY))
			{
				extract_obj(obj);
				return;
			}

			obj->cost = t_obj->cost; /* keep it standard */
			break;
		}
	}

	if (t_obj == nullptr)
	{
		obj->next_content = ch->carrying;
		ch->carrying = obj;
	}
	else
	{
		obj->next_content = t_obj->next_content;
		t_obj->next_content = obj;
	}

	obj->carried_by = ch;
	obj->in_room = nullptr;
	obj->in_obj = nullptr;
	ch->carry_number += get_obj_number(obj);
	ch->carry_weight += get_obj_weight(obj);
}